

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_4ae02a::Helper::MakeFilesFullPath
          (Helper *this,char *modeName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *relFiles,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *absFiles)

{
  pointer pbVar1;
  bool bVar2;
  string *psVar3;
  size_type sVar4;
  pointer args;
  string file;
  string local_d0;
  cmAlphaNum local_b0;
  string local_80;
  cmAlphaNum local_60;
  
  psVar3 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this->Makefile);
  args = (relFiles->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (relFiles->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (args == pbVar1) {
LAB_001dd1e0:
      return args == pbVar1;
    }
    std::__cxx11::string::string((string *)&local_80,(string *)args);
    sVar4 = cmGeneratorExpression::Find(&local_80);
    if (sVar4 != 0) {
      bVar2 = cmsys::SystemTools::FileIsFullPath(&local_80);
      if (!bVar2) {
        local_60.View_._M_str = (psVar3->_M_dataplus)._M_p;
        local_60.View_._M_len = psVar3->_M_string_length;
        local_b0.View_._M_len = 1;
        local_b0.View_._M_str = local_b0.Digits_;
        local_b0.Digits_[0] = '/';
        cmStrCat<std::__cxx11::string>(&local_d0,&local_60,&local_b0,args);
        std::__cxx11::string::operator=((string *)&local_80,(string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
      }
      if (sVar4 == 0xffffffffffffffff) {
        bVar2 = cmsys::SystemTools::FileIsSymlink(&local_80);
        if (!bVar2) {
          bVar2 = cmsys::SystemTools::FileIsDirectory(&local_80);
          if (bVar2) {
            local_60.View_._M_len = strlen(modeName);
            local_b0.View_._M_len = 0x12;
            local_b0.View_._M_str = " given directory \"";
            local_60.View_._M_str = modeName;
            cmStrCat<std::__cxx11::string,char[14]>
                      (&local_d0,&local_60,&local_b0,args,(char (*) [14])"\" to install.");
            SetError(this,&local_d0);
            std::__cxx11::string::~string((string *)&local_d0);
            std::__cxx11::string::~string((string *)&local_80);
            goto LAB_001dd1e0;
          }
        }
      }
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)absFiles,
               &local_80);
    std::__cxx11::string::~string((string *)&local_80);
    args = args + 1;
  } while( true );
}

Assistant:

bool Helper::MakeFilesFullPath(const char* modeName,
                               const std::vector<std::string>& relFiles,
                               std::vector<std::string>& absFiles)
{
  return this->MakeFilesFullPath(
    modeName, this->Makefile->GetCurrentSourceDirectory(), relFiles, absFiles);
}